

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O3

ReadFileResult
cmCMakePresetsGraphInternal::PresetConditionHelper
          (shared_ptr<cmCMakePresetsGraph::Condition> *out,Value *value)

{
  ReadFileResult RVar1;
  pointer *__ptr;
  __uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
  local_18;
  
  local_18._M_t.
  super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
  .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
       (tuple<cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
        )(_Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
          )0x0;
  RVar1 = anon_unknown.dwarf_2904b4::ConditionHelper
                    ((unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                      *)&local_18,value);
  std::__shared_ptr<cmCMakePresetsGraph::Condition,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<cmCMakePresetsGraph::Condition,(__gnu_cxx::_Lock_policy)2> *)out,
             (unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
              *)&local_18);
  if (local_18._M_t.
      super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
      .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
       )0x0) {
    (**(code **)(*(long *)local_18._M_t.
                          super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                          .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>.
                          _M_head_impl + 8))();
  }
  return RVar1;
}

Assistant:

ReadFileResult PresetConditionHelper(
  std::shared_ptr<cmCMakePresetsGraph::Condition>& out,
  const Json::Value* value)
{
  std::unique_ptr<cmCMakePresetsGraph::Condition> ptr;
  auto result = ConditionHelper(ptr, value);
  out = std::move(ptr);
  return result;
}